

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall HFSubConsumer::initialize(HFSubConsumer *this)

{
  zactor_t *pzVar1;
  zsock_t *self;
  zmq_pollitem_t *pzVar2;
  void *pvVar3;
  
  if ((this->super_HighFreqSub).actor == (zactor_t *)0x0) {
    pzVar1 = zactor_new(ringbufController,this);
    (this->super_HighFreqSub).actor = pzVar1;
  }
  self = zsock_new_req_checked
                   ((this->rependpoint)._M_dataplus._M_p,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                    ,0xaf);
  this->req = self;
  pzVar2 = (zmq_pollitem_t *)malloc(0x10);
  this->pollitem = pzVar2;
  pvVar3 = zsock_resolve(self);
  pzVar2 = this->pollitem;
  pzVar2->socket = pvVar3;
  pzVar2->fd = 0;
  pzVar2->events = 1;
  pzVar2->revents = 0;
  return;
}

Assistant:

void HFSubConsumer::initialize(){
    if(!actor)
        actor = zactor_new(ringbufController, this);
    //TODO: verify actor successfully initialized
    req = zsock_new_req(rependpoint.c_str());
    pollitem = (zmq_pollitem_t*)malloc(sizeof(zmq_pollitem_t));//{zsock_resolve(req), 0, ZMQ_POLLIN, 0};
    pollitem->socket = zsock_resolve(req);
    pollitem->fd = 0;
    pollitem->events = ZMQ_POLLIN;
    pollitem->revents = 0;
}